

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall
CLI::App::add_option
          (App *this,string *option_name,callback_t *option_callback,string *option_description,
          bool defaulted,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *func)

{
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar1;
  App *pAVar2;
  pointer puVar3;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var4;
  Option *pOVar5;
  string *psVar6;
  OptionAlreadyAdded *pOVar7;
  pointer pbVar8;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar9;
  __uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *this_00;
  string test_name;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  local_440;
  string local_420;
  string local_400;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  Option myopt;
  
  ::std::__cxx11::string::string((string *)&local_3a0,option_name);
  ::std::__cxx11::string::string((string *)&local_3c0,option_description);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(&local_3e0,option_callback);
  Option::Option(&myopt,&local_3a0,&local_3c0,&local_3e0,this);
  std::_Function_base::~_Function_base(&local_3e0.super__Function_base);
  ::std::__cxx11::string::~string((string *)&local_3c0);
  ::std::__cxx11::string::~string((string *)&local_3a0);
  _Var4 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::add_option(std::__cxx11::string,std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>,std::__cxx11::string,bool,std::function<std::__cxx11::string()>)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>>
                    ((this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&myopt);
  puVar1 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var4._M_current != puVar1) {
    puVar9 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (puVar9 == puVar1) {
        pOVar7 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_380,"added option matched existing option name",
                   (allocator<char> *)&test_name);
        OptionAlreadyAdded::OptionAlreadyAdded(pOVar7,&local_380);
        __cxa_throw(pOVar7,&OptionAlreadyAdded::typeinfo,Error::~Error);
      }
      psVar6 = Option::matching_name_abi_cxx11_
                         ((puVar9->_M_t).
                          super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
                          .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                          super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&myopt);
      puVar9 = puVar9 + 1;
    } while (psVar6->_M_string_length == 0);
    pOVar7 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
    ::std::operator+(&local_360,"added option matched existing option name: ",psVar6);
    OptionAlreadyAdded::OptionAlreadyAdded(pOVar7,&local_360);
    __cxa_throw(pOVar7,&OptionAlreadyAdded::typeinfo,Error::~Error);
  }
  if ((myopt.lnames_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       myopt.lnames_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (myopt.snames_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      myopt.snames_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    psVar6 = Option::get_single_name_abi_cxx11_(&myopt);
    ::std::operator+(&test_name,"--",psVar6);
    if (test_name._M_string_length == 3) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&test_name,0,1);
    }
    ::std::__cxx11::string::string((string *)&local_2e0,&test_name);
    pOVar5 = get_option_no_throw(this,&local_2e0);
    ::std::__cxx11::string::~string((string *)&local_2e0);
    if ((pOVar5 != (Option *)0x0) && ((pOVar5->super_OptionBase<CLI::Option>).configurable_ == true)
       ) {
      pOVar7 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_300,"added option positional name matches existing option: ",
                       &test_name);
      OptionAlreadyAdded::OptionAlreadyAdded(pOVar7,&local_300);
      __cxa_throw(pOVar7,&OptionAlreadyAdded::typeinfo,Error::~Error);
    }
    ::std::__cxx11::string::~string((string *)&test_name);
  }
  else if (this->parent_ != (App *)0x0) {
    for (pbVar8 = myopt.lnames_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 != myopt.lnames_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
      pAVar2 = this->parent_;
      ::std::__cxx11::string::string((string *)&local_2a0,pbVar8);
      pOVar5 = get_option_no_throw(pAVar2,&local_2a0);
      ::std::__cxx11::string::~string((string *)&local_2a0);
      if ((pOVar5 != (Option *)0x0) &&
         ((pOVar5->super_OptionBase<CLI::Option>).configurable_ == true)) {
        pOVar7 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        ::std::operator+(&local_320,"added option matches existing positional option: ",pbVar8);
        OptionAlreadyAdded::OptionAlreadyAdded(pOVar7,&local_320);
        __cxa_throw(pOVar7,&OptionAlreadyAdded::typeinfo,Error::~Error);
      }
    }
    for (pbVar8 = myopt.snames_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 != myopt.snames_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
      pAVar2 = this->parent_;
      ::std::__cxx11::string::string((string *)&local_2c0,pbVar8);
      pOVar5 = get_option_no_throw(pAVar2,&local_2c0);
      ::std::__cxx11::string::~string((string *)&local_2c0);
      if ((pOVar5 != (Option *)0x0) &&
         ((pOVar5->super_OptionBase<CLI::Option>).configurable_ == true)) {
        pOVar7 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        ::std::operator+(&local_340,"added option matches existing positional option: ",pbVar8);
        OptionAlreadyAdded::OptionAlreadyAdded(pOVar7,&local_340);
        __cxa_throw(pOVar7,&OptionAlreadyAdded::typeinfo,Error::~Error);
      }
    }
  }
  std::
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ::emplace_back<>(&this->options_);
  puVar3 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pOVar5 = (Option *)operator_new(0x250);
  ::std::__cxx11::string::string((string *)&local_400,option_name);
  ::std::__cxx11::string::string((string *)&local_420,option_description);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(&local_440,option_callback);
  Option::Option(pOVar5,&local_400,&local_420,&local_440,this);
  this_00 = (__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *)(puVar3 + -1);
  std::__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>::reset(this_00,pOVar5);
  std::_Function_base::~_Function_base(&local_440.super__Function_base);
  ::std::__cxx11::string::~string((string *)&local_420);
  ::std::__cxx11::string::~string((string *)&local_400);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::operator=(&((this_00->_M_t).
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->default_function_,func);
  if (defaulted) {
    Option::capture_default_str
              ((this_00->_M_t).
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
  }
  OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
            (&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>,
             (this_00->_M_t).
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
  pOVar5 = (this_00->_M_t).super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if ((!defaulted) && ((pOVar5->super_OptionBase<CLI::Option>).always_capture_default_ == true)) {
    Option::capture_default_str(pOVar5);
    pOVar5 = (this_00->_M_t).
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  }
  Option::~Option(&myopt);
  return pOVar5;
}

Assistant:

CLI11_INLINE Option *App::add_option(std::string option_name,
                                     callback_t option_callback,
                                     std::string option_description,
                                     bool defaulted,
                                     std::function<std::string()> func) {
    Option myopt{option_name, option_description, option_callback, this};

    if(std::find_if(std::begin(options_), std::end(options_), [&myopt](const Option_p &v) { return *v == myopt; }) ==
       std::end(options_)) {
        if(myopt.lnames_.empty() && myopt.snames_.empty()) {
            // if the option is positional only there is additional potential for ambiguities in config files and needs
            // to be checked
            std::string test_name = "--" + myopt.get_single_name();
            if(test_name.size() == 3) {
                test_name.erase(0, 1);
            }

            auto *op = get_option_no_throw(test_name);
            if(op != nullptr && op->get_configurable()) {
                throw(OptionAlreadyAdded("added option positional name matches existing option: " + test_name));
            }
        } else if(parent_ != nullptr) {
            for(auto &ln : myopt.lnames_) {
                auto *op = parent_->get_option_no_throw(ln);
                if(op != nullptr && op->get_configurable()) {
                    throw(OptionAlreadyAdded("added option matches existing positional option: " + ln));
                }
            }
            for(auto &sn : myopt.snames_) {
                auto *op = parent_->get_option_no_throw(sn);
                if(op != nullptr && op->get_configurable()) {
                    throw(OptionAlreadyAdded("added option matches existing positional option: " + sn));
                }
            }
        }
        options_.emplace_back();
        Option_p &option = options_.back();
        option.reset(new Option(option_name, option_description, option_callback, this));

        // Set the default string capture function
        option->default_function(func);

        // For compatibility with CLI11 1.7 and before, capture the default string here
        if(defaulted)
            option->capture_default_str();

        // Transfer defaults to the new option
        option_defaults_.copy_to(option.get());

        // Don't bother to capture if we already did
        if(!defaulted && option->get_always_capture_default())
            option->capture_default_str();

        return option.get();
    }
    // we know something matches now find what it is so we can produce more error information
    for(auto &opt : options_) {
        const auto &matchname = opt->matching_name(myopt);
        if(!matchname.empty()) {
            throw(OptionAlreadyAdded("added option matched existing option name: " + matchname));
        }
    }
    // this line should not be reached the above loop should trigger the throw
    throw(OptionAlreadyAdded("added option matched existing option name"));  // LCOV_EXCL_LINE
}